

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::mouseReleaseEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  int iVar2;
  State SVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  auVar6 = QEventPoint::position();
  dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_28.xp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
  dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_28.yp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
  iVar2 = QTreeViewPrivate::itemDecorationAt(this_00,&local_28);
  if (iVar2 == -1) {
    QAbstractItemView::mouseReleaseEvent((QAbstractItemView *)this,event);
    goto LAB_005a2d44;
  }
  SVar3 = QAbstractItemView::state((QAbstractItemView *)this);
  if (SVar3 == DragSelectingState) {
LAB_005a2c66:
    QAbstractItemView::setState((QAbstractItemView *)this,NoState);
  }
  else {
    SVar3 = QAbstractItemView::state((QAbstractItemView *)this);
    if (SVar3 == DraggingState) goto LAB_005a2c66;
  }
  pQVar4 = QWidget::style((QWidget *)this);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x28,0,this,0);
  if (iVar2 == 3) {
    auVar6 = QEventPoint::position();
    dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
    bVar1 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
    dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
    bVar1 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5);
    QTreeViewPrivate::expandOrCollapseItemAtPos(this_00,&local_28);
  }
LAB_005a2d44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (d->itemDecorationAt(event->position().toPoint()) == -1) {
        QAbstractItemView::mouseReleaseEvent(event);
    } else {
        if (state() == QAbstractItemView::DragSelectingState || state() == QAbstractItemView::DraggingState)
            setState(QAbstractItemView::NoState);
        if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonRelease)
            d->expandOrCollapseItemAtPos(event->position().toPoint());
    }
}